

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileData.h
# Opt level: O0

void __thiscall Assimp::Q3BSP::Q3BSPModel::Q3BSPModel(Q3BSPModel *this)

{
  allocator<char> local_11;
  Q3BSPModel *local_10;
  Q3BSPModel *this_local;
  
  (this->m_Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_Data);
  (this->m_Lumps).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Lumps).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Lumps).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::vector
            (&this->m_Lumps);
  (this->m_Vertices).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Vertices).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Vertices).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::vector
            (&this->m_Vertices);
  (this->m_Faces).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Faces).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Faces).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::vector
            (&this->m_Faces);
  (this->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_Indices);
  (this->m_Textures).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Textures).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Textures).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>::
  vector(&this->m_Textures);
  (this->m_Lightmaps).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Lightmaps).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Lightmaps).
  super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>::
  vector(&this->m_Lightmaps);
  *(undefined8 *)&(this->m_EntityData).super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  *(undefined8 *)
   &(this->m_EntityData).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = 0;
  *(undefined8 *)
   &(this->m_EntityData).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_EntityData);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_ModelName,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  return;
}

Assistant:

Q3BSPModel() :
        m_Data(),
        m_Lumps(),
        m_Vertices(),
        m_Faces(),
        m_Indices(),
        m_Textures(),
        m_Lightmaps(),
        m_EntityData(),
        m_ModelName( "" )
    {
        // empty
    }